

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.hh
# Opt level: O0

void __thiscall
roaring::RoaringSetBitBiDirectionalIterator::RoaringSetBitBiDirectionalIterator
          (RoaringSetBitBiDirectionalIterator *this,Roaring *parent,bool exhausted)

{
  byte in_DL;
  undefined8 in_RSI;
  roaring_bitmap_t *in_RDI;
  roaring_uint32_iterator_t *in_stack_ffffffffffffffd8;
  
  (in_RDI->high_low_container).size = 0;
  (in_RDI->high_low_container).allocation_size = 0;
  (in_RDI->high_low_container).containers = (void **)0x0;
  *(undefined1 *)&(in_RDI->high_low_container).keys = 0;
  *(undefined4 *)((long)&(in_RDI->high_low_container).keys + 4) = 0;
  *(undefined4 *)&(in_RDI->high_low_container).typecodes = 0;
  *(undefined4 *)((long)&(in_RDI->high_low_container).typecodes + 4) = 0;
  *(undefined4 *)&(in_RDI->high_low_container).flags = 0;
  (in_RDI->high_low_container).field_0x24 = 0;
  if ((in_DL & 1) == 0) {
    roaring_iterator_init(in_RDI,in_stack_ffffffffffffffd8);
  }
  else {
    (in_RDI->high_low_container).size = (int)in_RSI;
    (in_RDI->high_low_container).allocation_size = (int)((ulong)in_RSI >> 0x20);
    *(undefined4 *)((long)&(in_RDI->high_low_container).keys + 4) = 0x7fffffff;
    (in_RDI->high_low_container).field_0x24 = 0;
    *(undefined4 *)&(in_RDI->high_low_container).flags = 0xffffffff;
  }
  return;
}

Assistant:

explicit RoaringSetBitBiDirectionalIterator(const Roaring &parent,
                                                bool exhausted = false) {
        if (exhausted) {
            i.parent = &parent.roaring;
            i.container_index = INT32_MAX;
            i.has_value = false;
            i.current_value = UINT32_MAX;
        } else {
            api::roaring_iterator_init(&parent.roaring, &i);
        }
    }